

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O1

int mbedtls_timing_self_test(int verbose)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  __time_t _Var8;
  __suseconds_t _Var9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  unsigned_long uVar15;
  unsigned_long msec;
  unsigned_long msec_00;
  char *__s;
  ulong uVar16;
  bool bVar17;
  mbedtls_timing_delay_context ctx;
  timeval offset_2;
  timeval local_68 [2];
  undefined8 local_48;
  timeval local_40;
  
  if (verbose != 0) {
    puts("  TIMING tests note: will take some time!");
    printf("  TIMING test #1 (set_alarm / get_timer): ");
  }
  lVar14 = 1;
  do {
    gettimeofday(local_68,(__timezone_ptr_t)0x0);
    _Var9 = local_68[0].tv_usec;
    _Var8 = local_68[0].tv_sec;
    mbedtls_timing_alarmed = 0;
    signal(0xe,sighandler);
    alarm((uint)lVar14);
    do {
    } while (mbedtls_timing_alarmed == 0);
    gettimeofday(local_68,(__timezone_ptr_t)0x0);
    uVar13 = (local_68[0].tv_usec - _Var9) / 1000 + (local_68[0].tv_sec - _Var8) * 1000;
    if ((uVar13 < (ulong)(lVar14 * 800)) || (lVar14 * 0x4b0 + 300U < uVar13)) goto LAB_00141dc9;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  if (verbose != 0) {
    puts("passed");
    printf("  TIMING test #2 (set/get_delay        ): ");
  }
  uVar15 = 0x96;
  iVar11 = 400;
  uVar13 = 200;
  do {
    msec_00 = 0x32;
    uVar16 = 0;
    msec = uVar15;
    do {
      local_48 = CONCAT44(iVar11 + (int)uVar16,(int)uVar13);
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      local_68[0].tv_sec = local_40.tv_sec;
      local_68[0].tv_usec = local_40.tv_usec;
      busy_msleep(uVar13 - (uVar13 >> 3 & 0x1fffffff));
      iVar10 = mbedtls_timing_get_delay(local_68);
      if (iVar10 != 0) goto LAB_00141dc9;
      busy_msleep(uVar13 >> 2);
      iVar10 = mbedtls_timing_get_delay(local_68);
      if (iVar10 != 1) goto LAB_00141dc9;
      busy_msleep(msec);
      iVar10 = mbedtls_timing_get_delay(local_68);
      if (iVar10 != 1) goto LAB_00141dc9;
      busy_msleep(msec_00);
      iVar10 = mbedtls_timing_get_delay(local_68);
      if (iVar10 != 2) goto LAB_00141dc9;
      msec = msec + 0xaf;
      uVar16 = uVar16 + 200;
      msec_00 = msec_00 + 0x32;
    } while (uVar16 < 0xc9);
    uVar15 = uVar15 - 0x19;
    iVar11 = iVar11 + 200;
    bVar17 = uVar13 < 0xc9;
    uVar13 = uVar13 + 200;
  } while (bVar17);
  local_48 = 0;
  busy_msleep(200);
  iVar11 = mbedtls_timing_get_delay(local_68);
  if (iVar11 == -1) {
    uVar7 = extraout_var;
    if (verbose != 0) {
      puts("passed");
      printf("  TIMING test #3 (hardclock / get_timer): ");
      uVar7 = extraout_var_00;
    }
    iVar11 = 0;
    do {
      uVar13 = rdtsc();
      busy_msleep(1);
      uVar16 = rdtsc();
      uVar13 = (uVar16 & 0xffffffff00000000 | CONCAT44(extraout_var_01,(int)uVar16)) -
               (uVar13 & 0xffffffff00000000 | CONCAT44(uVar7,(int)uVar13));
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar13;
      auVar4 = auVar3 * ZEXT816(0xcccccccccccccccd);
      auVar6._8_8_ = 4;
      auVar6._0_8_ = 0xcccccccccccccccd;
      uVar16 = 2;
      while( true ) {
        uVar12 = rdtsc();
        busy_msleep(uVar16);
        uVar5 = rdtsc();
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar16;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (CONCAT44(extraout_var_02,(int)uVar5) | uVar5 & 0xffffffff00000000) -
                       (uVar12 & 0xffffffff00000000 | CONCAT44(auVar4._4_4_,(int)uVar12));
        uVar12 = SUB168(auVar2 / auVar1,0);
        auVar4._8_8_ = SUB168(auVar2 % auVar1,0);
        auVar4._0_8_ = uVar12;
        if ((uVar12 < uVar13 - uVar13 / 5) || (SUB168(auVar3 * auVar6,8) >> 2 < uVar12)) break;
        uVar16 = uVar16 + 1;
        if (uVar16 == 5) {
          if (verbose == 0) goto LAB_00141ed9;
          __s = "passed";
          goto LAB_00141eca;
        }
      }
      uVar7 = 0;
      bVar17 = iVar11 == 0;
      iVar11 = iVar11 + 1;
    } while (bVar17);
    if (verbose != 0) {
      __s = "failed (ignored)";
LAB_00141eca:
      puts(__s);
      putchar(10);
    }
LAB_00141ed9:
    iVar11 = 0;
  }
  else {
LAB_00141dc9:
    iVar11 = 1;
    if (verbose != 0) {
      puts("failed");
    }
  }
  return iVar11;
}

Assistant:

int mbedtls_timing_self_test( int verbose )
{
    unsigned long cycles, ratio;
    unsigned long millisecs, secs;
    int hardfail;
    struct mbedtls_timing_hr_time hires;
    uint32_t a, b;
    mbedtls_timing_delay_context ctx;

    if( verbose != 0 )
        mbedtls_printf( "  TIMING tests note: will take some time!\n" );


    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #1 (set_alarm / get_timer): " );

    for( secs = 1; secs <= 3; secs++ )
    {
        (void) mbedtls_timing_get_timer( &hires, 1 );

        mbedtls_set_alarm( (int) secs );
        while( !mbedtls_timing_alarmed )
            ;

        millisecs = mbedtls_timing_get_timer( &hires, 0 );

        /* For some reason on Windows it looks like alarm has an extra delay
         * (maybe related to creating a new thread). Allow some room here. */
        if( millisecs < 800 * secs || millisecs > 1200 * secs + 300 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #2 (set/get_delay        ): " );

    for( a = 200; a <= 400; a += 200 )
    {
        for( b = 200; b <= 400; b += 200 )
        {
            mbedtls_timing_set_delay( &ctx, a, a + b );

            busy_msleep( a - a / 8 );
            if( mbedtls_timing_get_delay( &ctx ) != 0 )
                FAIL;

            busy_msleep( a / 4 );
            if( mbedtls_timing_get_delay( &ctx ) != 1 )
                FAIL;

            busy_msleep( b - a / 8 - b / 8 );
            if( mbedtls_timing_get_delay( &ctx ) != 1 )
                FAIL;

            busy_msleep( b / 4 );
            if( mbedtls_timing_get_delay( &ctx ) != 2 )
                FAIL;
        }
    }

    mbedtls_timing_set_delay( &ctx, 0, 0 );
    busy_msleep( 200 );
    if( mbedtls_timing_get_delay( &ctx ) != -1 )
        FAIL;

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #3 (hardclock / get_timer): " );

    /*
     * Allow one failure for possible counter wrapping.
     * On a 4Ghz 32-bit machine the cycle counter wraps about once per second;
     * since the whole test is about 10ms, it shouldn't happen twice in a row.
     */
    hardfail = 0;

hard_test:
    if( hardfail > 1 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed (ignored)\n" );

        goto hard_test_done;
    }

    /* Get a reference ratio cycles/ms */
    millisecs = 1;
    cycles = mbedtls_timing_hardclock();
    busy_msleep( millisecs );
    cycles = mbedtls_timing_hardclock() - cycles;
    ratio = cycles / millisecs;

    /* Check that the ratio is mostly constant */
    for( millisecs = 2; millisecs <= 4; millisecs++ )
    {
        cycles = mbedtls_timing_hardclock();
        busy_msleep( millisecs );
        cycles = mbedtls_timing_hardclock() - cycles;

        /* Allow variation up to 20% */
        if( cycles / millisecs < ratio - ratio / 5 ||
            cycles / millisecs > ratio + ratio / 5 )
        {
            hardfail++;
            goto hard_test;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

hard_test_done:

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}